

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  BrandedDecl *pBVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Builder target;
  Reader source;
  Reader type;
  Reader source_00;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar6 [40];
  Builder target_01;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  StringPtr name_04;
  undefined4 uVar7;
  undefined1 auVar8 [8];
  ReaderFor<bool> RVar9;
  BrandScope **ppBVar10;
  ListElementCount LVar11;
  undefined1 auVar12 [8];
  WirePointer *pWVar13;
  ulong uVar14;
  undefined8 uVar15;
  ElementCount index;
  BrandScope *pBVar16;
  byte *pbVar17;
  ulong uVar18;
  SegmentBuilder *pSVar19;
  size_t sVar20;
  BrandScope **ppBVar21;
  Fault FVar22;
  NodeTranslator *this_00;
  undefined8 params_2;
  long lVar23;
  byte *pbVar24;
  undefined8 uVar25;
  undefined1 uVar26;
  Builder scope;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Reader name;
  Builder scopes;
  Builder annotationBuilder;
  Builder bindings;
  Reader annotation;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  SegmentReader *pSVar27;
  CapTableReader *pCVar28;
  void *pvVar29;
  WirePointer *pWVar30;
  StructDataBitCount SVar31;
  int iVar32;
  WirePointer *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  short in_stack_fffffffffffffb40;
  undefined2 uVar33;
  undefined6 in_stack_fffffffffffffb42;
  undefined8 uVar34;
  ushort uStack_48c;
  undefined1 uStack_489;
  byte *local_488;
  undefined1 local_478 [16];
  BrandScope **local_468;
  ArrayDisposer *local_460;
  NodeTranslator *local_458;
  StructReader local_450;
  ElementCount local_41c;
  undefined1 local_418 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_410;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a8;
  BrandScope *pBStack_3a0;
  undefined8 local_398 [6];
  byte *local_368;
  undefined8 uStack_360;
  StructBuilder local_358;
  ListBuilder local_328;
  undefined1 local_2f8 [16];
  Schema local_2e0;
  char *local_2d8;
  size_t local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  StructReader local_2b8;
  StructBuilder local_288;
  StructBuilder local_260;
  undefined1 local_238 [16];
  SegmentReader *pSStack_228;
  WirePointer *pWStack_220;
  byte *pbStack_210;
  undefined8 local_208;
  char local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  BrandScope *pBStack_1c0;
  undefined8 local_1b8 [6];
  PointerBuilder local_188;
  StructBuilder local_168;
  undefined1 local_140 [48];
  BrandScope *pBStack_110;
  word local_108;
  SegmentBuilder *pSStack_100;
  CapTableBuilder *local_f8;
  word *pwStack_f0;
  StructReader local_e8;
  StructReader local_b8 [2];
  ListBuilder local_58;
  
  local_2d0 = targetsFlagName.content.size_;
  local_2d8 = targetsFlagName.content.ptr;
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    params_2 = (SegmentBuilder *)0x20001;
    capnp::_::OrphanBuilder::initStructList
              ((OrphanBuilder *)local_238,(this->orphanage).arena,(this->orphanage).capTable,
               annotations.reader.elementCount,(StructSize)0x20001);
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_238._8_8_;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)pSStack_228;
    (__return_storage_ptr__->builder).location = (word *)pWStack_220;
    (__return_storage_ptr__->builder).tag.content = local_238._0_8_;
    capnp::_::OrphanBuilder::asStructList
              (&local_58,&__return_storage_ptr__->builder,(StructSize)0x20001);
    if (annotations.reader.elementCount != 0) {
      local_2c8 = local_1b8;
      local_2c0 = local_398;
      local_2e0.raw = (RawBrandedSchema *)(schemas::s_ec1619d4400a0290 + 0x48);
      index = 0;
      local_458 = this;
      do {
        capnp::_::ListReader::getStructElement(&local_2b8,&annotations.reader,index);
        capnp::_::ListBuilder::getStructElement(&local_358,&local_58,index);
        aStack_410.intValue = (int64_t)local_358.capTable;
        local_418 = (undefined1  [8])local_358.segment;
        aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_358.pointers;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)local_238,(PointerBuilder *)local_418,(StructSize)0x10002);
        *(undefined2 *)&((CapTableReader *)&pSStack_228->arena)->_vptr_CapTableReader = 0;
        LVar11 = local_2b8.nestingLimit;
        pSStack_228 = (SegmentReader *)local_2b8.pointers;
        if (local_2b8.pointerCount == 0) {
          pSStack_228 = (SegmentReader *)0x0;
          LVar11 = 0x7fffffff;
        }
        local_238._0_8_ = (SegmentBuilder *)0x0;
        local_238._8_8_ = (SegmentBuilder *)0x0;
        if (local_2b8.pointerCount != 0) {
          local_238._0_8_ = local_2b8.segment;
          local_238._8_8_ = local_2b8.capTable;
        }
        pWStack_220 = (WirePointer *)CONCAT44(pWStack_220._4_4_,LVar11);
        capnp::_::PointerReader::getStruct(&local_450,(PointerReader *)local_238,(word *)0x0);
        pWVar13 = (WirePointer *)0x0;
        FVar22.exception = (Exception *)0x0;
        pSVar19 = (SegmentBuilder *)0x0;
        local_488 = (byte *)CONCAT44(local_488._4_4_,0x7fffffff);
        implicitMethodParams.params.reader._39_1_ = uStack_489;
        implicitMethodParams.params.reader.structDataSize = 0;
        implicitMethodParams.params.reader.structPointerCount = 0;
        implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
        source._reader.capTable = local_450.capTable;
        source._reader.segment = local_450.segment;
        source._reader.data = local_450.data;
        source._reader.pointers = local_450.pointers;
        source._reader.dataSize = local_450.dataSize;
        source._reader.pointerCount = local_450.pointerCount;
        source._reader._38_2_ = local_450._38_2_;
        source._reader.nestingLimit = local_450.nestingLimit;
        source._reader._44_4_ = local_450._44_4_;
        auVar6 = ZEXT1640(ZEXT816(0));
        implicitMethodParams.scopeId = auVar6._0_8_;
        implicitMethodParams.params.reader.segment = (SegmentReader *)auVar6._8_8_;
        implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar6._16_8_;
        implicitMethodParams.params.reader.ptr = (byte *)auVar6._24_8_;
        implicitMethodParams.params.reader.elementCount = auVar6._32_4_;
        implicitMethodParams.params.reader.step = auVar6._36_4_;
        implicitMethodParams.params.reader._40_8_ = local_488;
        local_41c = index;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_418,
                   (this->localBrand).ptr,source,this->resolver,implicitMethodParams);
        uVar26 = local_418[0];
        local_238[0] = local_418[0];
        if (local_418[0] == VOID) {
          local_238._8_4_ = aStack_410.intValue._0_4_;
          if (aStack_410.intValue._0_4_ == 2) {
            pWStack_220 = (WirePointer *)CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
            pSStack_228 = (SegmentReader *)aStack_410.textValue.super_StringPtr.content.size_;
          }
          else if (aStack_410.intValue._0_4_ == 1) {
            local_208 = aStack_410._40_8_;
            pWStack_220 = (WirePointer *)CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
            pbStack_210 = aStack_410.listValue.reader.ptr;
            pSStack_228 = (SegmentReader *)aStack_410.textValue.super_StringPtr.content.size_;
            local_200 = aStack_410.field12[0x30];
            if (aStack_410.field12[0x30] == '\x01') {
              local_1d8 = local_3b8;
              uStack_1d0 = uStack_3b0;
              local_1e8 = local_3c8;
              uStack_1e0 = uStack_3c0;
              local_1f8 = aStack_410._56_8_;
              uStack_1f0 = uStack_3d0;
            }
          }
          local_1c8 = local_3a8;
          pBStack_1c0 = pBStack_3a0;
          uVar25 = *local_2c0;
          uVar15 = local_2c0[1];
          uVar34 = local_2c0[2];
          uVar4 = local_2c0[3];
          uVar5 = local_2c0[5];
          local_2c8[4] = local_2c0[4];
          local_2c8[5] = uVar5;
          local_2c8[2] = uVar34;
          local_2c8[3] = uVar4;
          *local_2c8 = uVar25;
          local_2c8[1] = uVar15;
          iVar32 = local_450.nestingLimit;
          if (aStack_410.intValue._0_4_ == 2) {
            if (in_stack_fffffffffffffb40 == 0xb) {
              in_stack_fffffffffffffb40 = 0xb;
            }
            else {
              pEVar3 = this->errorReporter;
              name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
              name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
              name_01._reader.data._0_2_ = in_stack_fffffffffffffb40;
              name_01._reader.data._2_6_ = in_stack_fffffffffffffb42;
              name_01._reader.pointers = (WirePointer *)FVar22.exception;
              name_01._reader._32_8_ = pSVar19;
              name_01._reader._40_8_ = pWVar13;
              expressionString(name_01);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)local_418,(kj *)0x26506b,(char (*) [2])&stack0xfffffffffffffb48,
                         (String *)"\' is not an annotation.",(char (*) [24])params_2);
              auVar12 = (undefined1  [8])(SegmentBuilder *)0x2781dd;
              if (aStack_410._0_8_ != (CapTableBuilder *)0x0) {
                auVar12 = local_418;
              }
              params_2 = aStack_410.textValue.super_StringPtr.content.ptr +
                         (aStack_410._0_8_ == (CapTableBuilder *)0x0);
              uVar14 = 0;
              if (local_450.dataSize < 0x40) {
                uVar18 = 0;
              }
              else {
                uVar18 = (ulong)*(uint *)((long)local_450.data + 4);
                if (0x9f < local_450.dataSize) {
                  uVar14 = (ulong)*(uint *)((long)local_450.data + 0x10);
                }
              }
              (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar18,uVar14,auVar12);
              auVar12 = local_418;
              if (local_418 != (undefined1  [8])0x0) {
                params_2 = aStack_410.intValue;
                _local_418 = (undefined1  [16])0x0;
                (**((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                   _vptr_CapTableReader)
                          (aStack_410.textValue.super_StringPtr.content.size_,auVar12,1);
              }
              if (FVar22.exception != (Exception *)0x0) {
                (**(code **)*pWVar13)(pWVar13,FVar22.exception,1);
                params_2 = pSVar19;
              }
            }
          }
          else if ((short)pbStack_210 == 0xb) {
            if (aStack_410.intValue._0_4_ != 1) {
              _local_418 = (undefined1  [16])0x0;
              kj::_::Debug::Fault::init
                        ((Fault *)&stack0xfffffffffffffb48,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                        );
              kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb48);
            }
            local_478 = (undefined1  [16])0x0;
            local_468 = (BrandScope **)0x0;
            ppBVar10 = (BrandScope **)0x0;
            uVar33 = SUB82(pBStack_3a0,0);
            in_stack_fffffffffffffb42 = (undefined6)((ulong)pBStack_3a0 >> 0x10);
            pBVar16 = pBStack_3a0;
            do {
              if (((pBVar16->params).size_ != 0) ||
                 ((pBVar16->inherited == true && (pBVar16->leafParamCount != 0)))) {
                if (ppBVar10 == local_468) {
                  sVar20 = (long)ppBVar10 - local_478._0_8_ >> 2;
                  if (ppBVar10 == (BrandScope **)local_478._0_8_) {
                    sVar20 = 4;
                  }
                  kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity
                            ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)local_478,
                             sVar20);
                  ppBVar10 = (BrandScope **)local_478._8_8_;
                }
                *ppBVar10 = pBVar16;
                ppBVar10 = (BrandScope **)(local_478._8_8_ + 8);
                local_478._8_8_ = ppBVar10;
              }
              pBVar16 = (pBVar16->parent).ptr.ptr;
            } while (pBVar16 != (BrandScope *)0x0);
            ppBVar21 = (BrandScope **)local_478._0_8_;
            if (ppBVar10 != (BrandScope **)local_478._0_8_) {
              local_328.ptr = (byte *)((long)local_358.pointers + 8);
              local_328.segment = local_358.segment;
              local_328.capTable = local_358.capTable;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)&stack0xfffffffffffffb48,(PointerBuilder *)&local_328,
                         (StructSize)0x10000);
              local_328.ptr = (byte *)0x0;
              local_328.segment = (SegmentBuilder *)FVar22.exception;
              local_328.capTable = (CapTableBuilder *)pSVar19;
              capnp::_::PointerBuilder::initStructList
                        ((ListBuilder *)local_418,(PointerBuilder *)&local_328,
                         (ElementCount)((ulong)(local_478._8_8_ - local_478._0_8_) >> 3),
                         (StructSize)0x10002);
              ppBVar21 = (BrandScope **)local_478._0_8_;
              if (local_478._8_8_ - local_478._0_8_ != 0) {
                pbVar17 = (byte *)((long)(local_478._8_8_ - local_478._0_8_) >> 3);
                pbVar24 = (byte *)0x0;
                local_2f8._0_8_ = pbVar17;
                do {
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&stack0xfffffffffffffb48,(ListBuilder *)local_418,
                             (ElementCount)pbVar24);
                  pBVar16 = *(BrandScope **)(local_478._0_8_ + ((ulong)pbVar24 & 0xffffffff) * 8);
                  uVar7 = *(undefined4 *)((long)&pBVar16->leafId + 4);
                  pWVar13->offsetAndKind = (WireValue<uint32_t>)*(undefined4 *)&pBVar16->leafId;
                  pWVar13->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)uVar7;
                  local_368 = pbVar24;
                  if (pBVar16->inherited == true) {
                    *(undefined2 *)&pWVar13[1].offsetAndKind.value = 1;
                  }
                  else {
                    sVar20 = (pBVar16->params).size_;
                    *(undefined2 *)&pWVar13[1].offsetAndKind.value = 0;
                    local_288.data = (undefined2 *)0x0;
                    local_288.segment = (SegmentBuilder *)FVar22.exception;
                    local_288.capTable = (CapTableBuilder *)pSVar19;
                    capnp::_::PointerBuilder::initStructList
                              (&local_328,(PointerBuilder *)&local_288,(ElementCount)sVar20,
                               (StructSize)0x10001);
                    uVar14 = (ulong)local_328.elementCount;
                    if (uVar14 != 0) {
                      lVar23 = 0;
                      uVar18 = 0;
                      do {
                        pBVar1 = ((*(BrandScope **)
                                    (local_478._0_8_ + ((ulong)pbVar24 & 0xffffffff) * 8))->params).
                                 ptr;
                        pEVar3 = *(ErrorReporter **)
                                  (CONCAT62(in_stack_fffffffffffffb42,uVar33) + 0x10);
                        capnp::_::ListBuilder::getStructElement
                                  (&local_288,&local_328,(ElementCount)uVar18);
                        *(undefined2 *)local_288.data = 1;
                        local_188.segment = local_288.segment;
                        local_188.capTable = local_288.capTable;
                        local_188.pointer = local_288.pointers;
                        capnp::_::PointerBuilder::initStruct
                                  (&local_260,&local_188,(StructSize)0x10003);
                        target._builder.segment._1_7_ = local_260.segment._1_7_;
                        target._builder.segment._0_1_ = (char)local_260.segment;
                        target._builder.capTable = local_260.capTable;
                        target._builder.data = local_260.data;
                        target._builder.pointers = local_260.pointers;
                        target._builder.dataSize = local_260.dataSize;
                        target._builder._36_4_ = local_260._36_4_;
                        BrandedDecl::compileAsType
                                  ((BrandedDecl *)((long)&(pBVar1->body).tag + lVar23),pEVar3,target
                                  );
                        uVar18 = uVar18 + 1;
                        lVar23 = lVar23 + 0xa8;
                      } while (uVar14 != uVar18);
                    }
                    pbVar17 = (byte *)local_2f8._0_8_;
                    this = local_458;
                  }
                  pbVar24 = local_368 + 1;
                } while (pbVar24 != pbVar17);
                ppBVar21 = (BrandScope **)local_478._0_8_;
              }
            }
            ppBVar10 = local_468;
            if (ppBVar21 != (BrandScope **)0x0) {
              local_478 = (undefined1  [16])0x0;
              local_468 = (BrandScope **)0x0;
              params_2 = (long)ppBVar10 - (long)ppBVar21 >> 3;
              (**local_460->_vptr_ArrayDisposer)(local_460,ppBVar21,8);
            }
            pSVar27 = pSStack_228;
            *(SegmentReader **)local_358.data = pSStack_228;
            pRVar2 = this->resolver;
            capnp::_::PointerBuilder::getStruct
                      ((StructBuilder *)local_418,(PointerBuilder *)&stack0xfffffffffffffb48,
                       (StructSize)0x10000,(word *)0x0);
            capnp::_::StructBuilder::asReader((StructBuilder *)local_418);
            (*pRVar2->_vptr_Resolver[6])(&local_260,pRVar2,pSVar27);
            local_328.segment =
                 (SegmentBuilder *)CONCAT71(local_328.segment._1_7_,(char)local_260.segment);
            if ((char)local_260.segment == '\x01') {
              local_328.capTable = local_260.capTable;
              Schema::getProto((Reader *)local_418,(Schema *)&local_328.capTable);
              uVar15 = aStack_410.listValue.reader.ptr;
              uVar7 = aStack_410._28_4_;
              uVar25 = aStack_410.intValue;
              lVar23 = CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
              uVar33 = local_418._0_2_;
              in_stack_fffffffffffffb42 = local_418._2_6_;
              uStack_48c = (ushort)aStack_410._28_4_;
              uStack_489 = (undefined1)((uint)aStack_410._28_4_ >> 0x18);
              local_488 = aStack_410.listValue.reader.ptr;
              name_04.content.size_ = local_2d0;
              name_04.content.ptr = local_2d8;
              FVar22.exception = (Exception *)local_2e0.raw;
              auVar12 = local_418;
              uVar34 = aStack_410.intValue;
              DynamicStruct::Reader::get
                        ((Reader *)local_418,(Reader *)&stack0xfffffffffffffb48,name_04);
              RVar9 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_418)
              ;
              DynamicValue::Reader::~Reader((Reader *)local_418);
              if (!RVar9) {
                pEVar3 = local_458->errorReporter;
                name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
                name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
                name_00._reader.data._0_2_ = uVar33;
                name_00._reader.data._2_6_ = in_stack_fffffffffffffb42;
                name_00._reader.pointers = (WirePointer *)FVar22.exception;
                name_00._reader._32_8_ = auVar12;
                name_00._reader._40_8_ = uVar34;
                expressionString(name_00);
                kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                          ((String *)local_418,(kj *)0x26506b,(char (*) [2])&stack0xfffffffffffffb48
                           ,(String *)"\' cannot be applied to this kind of declaration.",
                           (char (*) [49])params_2);
                params_2 = aStack_410.textValue.super_StringPtr.content.ptr +
                           (aStack_410._0_8_ == (CapTableBuilder *)0x0);
                uVar14 = 0;
                if (local_450.dataSize < 0x40) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = (ulong)*(uint *)((long)local_450.data + 4);
                  if (0x9f < local_450.dataSize) {
                    uVar14 = (ulong)*(uint *)((long)local_450.data + 0x10);
                  }
                }
                (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar18,uVar14);
                auVar8 = local_418;
                if (local_418 != (undefined1  [8])0x0) {
                  params_2 = aStack_410.intValue;
                  _local_418 = (undefined1  [16])0x0;
                  (**((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                     _vptr_CapTableReader)
                            (aStack_410.textValue.super_StringPtr.content.size_,auVar8,1);
                }
                if (FVar22.exception != (Exception *)0x0) {
                  (*(code *)((RawSchema *)(((SegmentBuilder *)uVar34)->super_SegmentReader).arena)->
                            id)(uVar34,FVar22.exception,1);
                  params_2 = auVar12;
                }
              }
              this = local_458;
              if ((local_2b8.dataSize < 0x10) || (*local_2b8.data == 0)) {
                local_368 = (byte *)uVar15;
                uStack_360 = 0;
                if (uStack_48c < 4) {
                  uVar15 = (SegmentBuilder *)0x0;
                  pWVar13 = (WirePointer *)0x0;
                  FVar22.exception = (Exception *)0x0;
                }
                else {
                  pWVar13 = (WirePointer *)(lVar23 + 0x18);
                  FVar22.exception = (Exception *)CONCAT62(in_stack_fffffffffffffb42,uVar33);
                  uVar15 = uVar25;
                }
                capnp::_::PointerReader::getStruct
                          ((StructReader *)local_418,(PointerReader *)&stack0xfffffffffffffb48,
                           (word *)0x0);
                if ((aStack_410._24_4_ < 0x10) ||
                   (*(short *)&((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                               _vptr_CapTableReader == 0)) {
                  capnp::_::PointerBuilder::getStruct
                            ((StructBuilder *)local_418,(PointerBuilder *)&stack0xfffffffffffffb48,
                             (StructSize)0x10002,(word *)0x0);
                  *(undefined2 *)
                   &((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                    _vptr_CapTableReader = 0;
                }
                else {
                  pEVar3 = this->errorReporter;
                  name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
                  name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
                  name_03._reader.data._0_2_ = uVar33;
                  name_03._reader.data._2_6_ = in_stack_fffffffffffffb42;
                  name_03._reader.pointers = (WirePointer *)FVar22.exception;
                  name_03._reader._32_8_ = uVar15;
                  name_03._reader._40_8_ = pWVar13;
                  expressionString(name_03);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                            ((String *)local_418,(kj *)0x26506b,
                             (char (*) [2])&stack0xfffffffffffffb48,(String *)"\' requires a value."
                             ,(char (*) [20])params_2);
                  params_2 = aStack_410.textValue.super_StringPtr.content.ptr +
                             (aStack_410._0_8_ == (CapTableBuilder *)0x0);
                  uVar14 = 0;
                  if (local_450.dataSize < 0x40) {
                    uVar18 = 0;
                  }
                  else {
                    uVar18 = (ulong)*(uint *)((long)local_450.data + 4);
                    if (0x9f < local_450.dataSize) {
                      uVar14 = (ulong)*(uint *)((long)local_450.data + 0x10);
                    }
                  }
                  (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar18,uVar14);
                  auVar12 = local_418;
                  if (local_418 != (undefined1  [8])0x0) {
                    params_2 = aStack_410.intValue;
                    _local_418 = (undefined1  [16])0x0;
                    (**((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                       _vptr_CapTableReader)
                              (aStack_410.textValue.super_StringPtr.content.size_,auVar12,1);
                  }
                  if (FVar22.exception != (Exception *)0x0) {
                    (**(code **)*pWVar13)(pWVar13,FVar22.exception,1);
                    params_2 = uVar15;
                  }
                  if (uStack_48c < 4) {
                    aStack_410._16_4_ = 0x7fffffff;
                    uVar25 = (SegmentBuilder *)0x0;
                    aStack_410.textValue.super_StringPtr.content.size_ =
                         (size_t)(SegmentReader *)0x0;
                    local_418 = (undefined1  [8])0x0;
                  }
                  else {
                    aStack_410.structValue.reader.segment = (SegmentReader *)(lVar23 + 0x18);
                    local_418 = (undefined1  [8])CONCAT62(in_stack_fffffffffffffb42,uVar33);
                    aStack_410._16_4_ = (ListElementCount)local_368;
                  }
                  aStack_410.intValue = uVar25;
                  capnp::_::PointerReader::getStruct
                            (local_b8,(PointerReader *)local_418,(word *)0x0);
                  aStack_410.intValue = (int64_t)local_358.capTable;
                  local_418 = (undefined1  [8])local_358.segment;
                  aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_358.pointers;
                  this_00 = (NodeTranslator *)local_140;
                  capnp::_::PointerBuilder::getStruct
                            ((StructBuilder *)this_00,(PointerBuilder *)local_418,
                             (StructSize)0x10002,(word *)0x0);
                  type._reader.capTable = local_b8[0].capTable;
                  type._reader.segment = local_b8[0].segment;
                  type._reader.data = local_b8[0].data;
                  type._reader.pointers = local_b8[0].pointers;
                  type._reader.dataSize = (StructDataBitCount)local_b8[0]._32_8_;
                  type._reader._36_4_ = SUB84(local_b8[0]._32_8_,4);
                  type._reader.nestingLimit = (int)local_b8[0]._40_8_;
                  type._reader._44_4_ = SUB84(local_b8[0]._40_8_,4);
                  target_00._builder.capTable = (CapTableBuilder *)local_140._8_8_;
                  target_00._builder.segment = (SegmentBuilder *)local_140._0_8_;
                  target_00._builder.data = (void *)local_140._16_8_;
                  target_00._builder.pointers = (WirePointer *)local_140._24_8_;
                  target_00._builder.dataSize = local_140._32_4_;
                  target_00._builder.pointerCount = local_140._36_2_;
                  target_00._builder._38_2_ = local_140._38_2_;
                  compileDefaultDefaultValue(this_00,type,target_00);
                }
              }
              else {
                pSVar19 = (SegmentBuilder *)CONCAT62(in_stack_fffffffffffffb42,uVar33);
                if (*local_2b8.data == 1) {
                  local_368 = (byte *)uVar15;
                  uStack_360 = 0;
                  aStack_410.structValue.reader.segment =
                       (SegmentReader *)((long)local_2b8.pointers + 8);
                  local_418 = (undefined1  [8])local_2b8.segment;
                  aStack_410.intValue = (int64_t)local_2b8.capTable;
                  aStack_410._16_4_ = local_2b8.nestingLimit;
                  if (local_2b8.pointerCount < 2) {
                    aStack_410.textValue.super_StringPtr.content.size_ = (size_t)(SegmentId *)0x0;
                    aStack_410._16_4_ = 0x7fffffff;
                    local_418 = (undefined1  [8])(SegmentBuilder *)0x0;
                    aStack_410.intValue = (int64_t)(SegmentBuilder *)0x0;
                  }
                  local_2f8 = ZEXT416((uint)uVar7);
                  capnp::_::PointerReader::getStruct
                            (&local_e8,(PointerReader *)local_418,(word *)0x0);
                  if ((ushort)local_2f8._0_2_ < 4) {
                    aStack_410._16_4_ = 0x7fffffff;
                    uVar25 = (SegmentBuilder *)0x0;
                    aStack_410.textValue.super_StringPtr.content.size_ =
                         (size_t)(SegmentReader *)0x0;
                    pSVar19 = (SegmentBuilder *)0x0;
                  }
                  else {
                    aStack_410.structValue.reader.segment = (SegmentReader *)(lVar23 + 0x18);
                    aStack_410._16_4_ = (ListElementCount)local_368;
                  }
                  local_418 = (undefined1  [8])pSVar19;
                  aStack_410.intValue = uVar25;
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)(local_140 + 0x28),(PointerReader *)local_418,
                             (word *)0x0);
                  aStack_410.intValue = (int64_t)local_358.capTable;
                  local_418 = (undefined1  [8])local_358.segment;
                  aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_358.pointers;
                  capnp::_::PointerBuilder::getStruct
                            (&local_168,(PointerBuilder *)local_418,(StructSize)0x10002,(word *)0x0)
                  ;
                  source_00._reader.capTable = local_e8.capTable;
                  source_00._reader.segment = local_e8.segment;
                  source_00._reader.data = local_e8.data;
                  source_00._reader.pointers = local_e8.pointers;
                  source_00._reader.dataSize = local_e8.dataSize;
                  source_00._reader._36_4_ = local_e8._36_4_;
                  source_00._reader.nestingLimit = local_e8.nestingLimit;
                  source_00._reader._44_4_ = local_e8._44_4_;
                  type_00._reader.capTable = (CapTableReader *)pBStack_110;
                  type_00._reader.segment = (SegmentReader *)local_140._40_8_;
                  type_00._reader.data = (void *)local_108.content;
                  type_00._reader.pointers = (WirePointer *)pSStack_100;
                  type_00._reader._32_8_ = local_f8;
                  type_00._reader._40_8_ = pwStack_f0;
                  target_01._builder.capTable = local_168.capTable;
                  target_01._builder.segment = local_168.segment;
                  target_01._builder.data = local_168.data;
                  target_01._builder.pointers = local_168.pointers;
                  target_01._builder.dataSize = local_168.dataSize;
                  target_01._builder.pointerCount = local_168.pointerCount;
                  target_01._builder._38_2_ = local_168._38_2_;
                  in_stack_fffffffffffffb30 = local_168.pointers;
                  in_stack_fffffffffffffb38 = local_168._32_8_;
                  compileBootstrapValue(this,source_00,type_00,target_01,(Schema)local_328.capTable)
                  ;
                }
              }
            }
            in_stack_fffffffffffffb40 = 0xb;
            uVar26 = local_238[0];
          }
          else {
            pEVar3 = this->errorReporter;
            name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb38;
            name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb30;
            name_02._reader.data._0_2_ = (short)pbStack_210;
            name_02._reader.data._2_6_ = in_stack_fffffffffffffb42;
            name_02._reader.pointers = (WirePointer *)FVar22.exception;
            name_02._reader._32_8_ = pSVar19;
            name_02._reader._40_8_ = pWVar13;
            pSVar27 = local_450.segment;
            pCVar28 = local_450.capTable;
            pvVar29 = local_450.data;
            pWVar30 = local_450.pointers;
            SVar31 = local_450.dataSize;
            in_stack_fffffffffffffb40 = (short)pbStack_210;
            expressionString(name_02);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)local_418,(kj *)0x26506b,(char (*) [2])&stack0xfffffffffffffb48,
                       (String *)"\' is not an annotation.",(char (*) [24])params_2);
            auVar12 = (undefined1  [8])(SegmentBuilder *)0x2781dd;
            if (aStack_410._0_8_ != (CapTableBuilder *)0x0) {
              auVar12 = local_418;
            }
            params_2 = aStack_410.textValue.super_StringPtr.content.ptr +
                       (aStack_410._0_8_ == (CapTableBuilder *)0x0);
            uVar14 = 0;
            if (local_450.dataSize < 0x40) {
              uVar18 = 0;
            }
            else {
              uVar18 = (ulong)*(uint *)((long)local_450.data + 4);
              if (0x9f < local_450.dataSize) {
                uVar14 = (ulong)*(uint *)((long)local_450.data + 0x10);
              }
            }
            (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar18,uVar14,auVar12);
            auVar12 = local_418;
            if (local_418 != (undefined1  [8])0x0) {
              params_2 = aStack_410.intValue;
              _local_418 = (undefined1  [16])0x0;
              (**((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                 _vptr_CapTableReader)
                        (aStack_410.textValue.super_StringPtr.content.size_,auVar12,1,params_2,
                         params_2,0,pSVar27,pCVar28,pvVar29,pWVar30,SVar31,iVar32);
            }
            if (FVar22.exception != (Exception *)0x0) {
              (**(code **)*pWVar13)(pWVar13,FVar22.exception,1);
              params_2 = pSVar19;
            }
          }
        }
        pBVar16 = pBStack_1c0;
        if (((uVar26 & VOID) != UNKNOWN) && (pBStack_1c0 != (BrandScope *)0x0)) {
          pBStack_1c0 = (BrandScope *)0x0;
          (**(code **)*local_1c8)
                    (local_1c8,
                     (pBVar16->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                     (long)&(pBVar16->super_Refcounted).super_Disposer._vptr_Disposer);
        }
        index = local_41c + 1;
      } while (index < annotations.reader.elementCount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_MAYBE(decl, compileDeclExpression(name, noImplicitParams())) {
      KJ_IF_MAYBE(kind, decl->getKind()) {
        if (*kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl->getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_MAYBE(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema->getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      *annotationSchema);
                break;
            }
          }
        }
      } else if (*kind != Declaration::ANNOTATION) {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }

  return result;
}